

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

bool __thiscall ON_Brep::IsValidVertex(ON_Brep *this,int vertex_index,ON_TextLog *text_log)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ON_BrepVertex *pOVar6;
  uint *puVar7;
  ON_BrepEdge *pOVar8;
  ON_BrepEdge *edge;
  uint local_40;
  int ei;
  int vei;
  int j;
  int i;
  int vertex_edge_count;
  ON_BrepVertex *vertex;
  ON_TextLog *text_log_local;
  int vertex_index_local;
  ON_Brep *this_local;
  
  if ((vertex_index < 0) ||
     (iVar2 = ON_ClassArray<ON_BrepVertex>::Count((ON_ClassArray<ON_BrepVertex> *)&this->m_V),
     iVar2 <= vertex_index)) {
    if (text_log != (ON_TextLog *)0x0) {
      uVar3 = ON_ClassArray<ON_BrepVertex>::Count((ON_ClassArray<ON_BrepVertex> *)&this->m_V);
      ON_TextLog::Print(text_log,
                        "brep vertex_index = %d (should be >=0 and <%d=brep.m_V.Count() ).\n",
                        (ulong)(uint)vertex_index,(ulong)uVar3);
    }
    this_local._7_1_ = ON_BrepIsNotValid();
  }
  else {
    pOVar6 = ON_ClassArray<ON_BrepVertex>::operator[]
                       ((ON_ClassArray<ON_BrepVertex> *)&this->m_V,vertex_index);
    if (pOVar6->m_vertex_index == vertex_index) {
      iVar2 = ON_SimpleArray<int>::Count(&pOVar6->m_ei);
      for (local_40 = 0; (int)local_40 < iVar2; local_40 = local_40 + 1) {
        puVar7 = (uint *)ON_SimpleArray<int>::operator[](&pOVar6->m_ei,local_40);
        uVar3 = *puVar7;
        if (((int)uVar3 < 0) ||
           (iVar4 = ON_ClassArray<ON_BrepEdge>::Count((ON_ClassArray<ON_BrepEdge> *)&this->m_E),
           iVar4 <= (int)uVar3)) {
          if (text_log != (ON_TextLog *)0x0) {
            ON_TextLog::Print(text_log,"brep.m_V[%d] vertex is not valid.\n",
                              (ulong)(uint)vertex_index);
            ON_TextLog::PushIndent(text_log);
            uVar5 = ON_ClassArray<ON_BrepEdge>::Count((ON_ClassArray<ON_BrepEdge> *)&this->m_E);
            ON_TextLog::Print(text_log,"vertex.m_ei[%d] = %d (should be >=0 and <%d).\n",
                              (ulong)local_40,(ulong)uVar3,(ulong)uVar5);
            ON_TextLog::PopIndent(text_log);
          }
          bVar1 = ON_BrepIsNotValid();
          return bVar1;
        }
        pOVar8 = ON_ClassArray<ON_BrepEdge>::operator[]
                           ((ON_ClassArray<ON_BrepEdge> *)&this->m_E,uVar3);
        if (uVar3 != pOVar8->m_edge_index) {
          if (text_log != (ON_TextLog *)0x0) {
            ON_TextLog::Print(text_log,"brep.m_V[%d] vertex is not valid.\n",
                              (ulong)(uint)vertex_index);
            ON_TextLog::PushIndent(text_log);
            ON_TextLog::Print(text_log,"vertex.m_ei[%d] = %d is a deleted edge.\n",(ulong)local_40,
                              (ulong)uVar3);
            ON_TextLog::PopIndent(text_log);
          }
          bVar1 = ON_BrepIsNotValid();
          return bVar1;
        }
        vei = 0;
        while( true ) {
          if ((int)local_40 <= vei) goto LAB_0052eae7;
          puVar7 = (uint *)ON_SimpleArray<int>::operator[](&pOVar6->m_ei,vei);
          if (*puVar7 == uVar3) break;
          vei = vei + 1;
        }
        if ((pOVar8->m_vi[0] != vertex_index) || (ei = vei, pOVar8->m_vi[1] != vertex_index)) {
          if (text_log != (ON_TextLog *)0x0) {
            ON_TextLog::Print(text_log,"brep.m_V[%d] vertex is not valid.\n",
                              (ulong)(uint)vertex_index);
            ON_TextLog::PushIndent(text_log);
            ON_TextLog::Print(text_log,
                              "vertex.m_ei[%d] and vertex.m_ei[%d] = %d but brep.m_E[%d].m_vi[0] = %d"
                              ,(ulong)(uint)vei,(ulong)local_40,(ulong)uVar3,(ulong)uVar3,
                              pOVar8->m_vi[0]);
            ON_TextLog::Print(text_log,
                              "and ON_Brep.m_E[%d].m_vi[1] = %d (both m_vi[] values should be %d).\n"
                              ,(ulong)uVar3,(ulong)(uint)pOVar8->m_vi[1],(ulong)(uint)vertex_index);
            ON_TextLog::PopIndent(text_log);
          }
          bVar1 = ON_BrepIsNotValid();
          return bVar1;
        }
        while (ei = ei + 1, ei < (int)local_40) {
          puVar7 = (uint *)ON_SimpleArray<int>::operator[](&pOVar6->m_ei,ei);
          if (*puVar7 == uVar3) {
            if (text_log != (ON_TextLog *)0x0) {
              ON_TextLog::Print(text_log,"brep.m_V[%d] vertex is not valid.\n",
                                (ulong)(uint)vertex_index);
              ON_TextLog::PushIndent(text_log);
              ON_TextLog::Print(text_log,
                                "vertex.m_ei[%d,%d,%d] = %d. An open edge index should appear once\n"
                                ,(ulong)(uint)vei,(ulong)local_40,(ulong)(uint)ei,(ulong)uVar3);
              ON_TextLog::Print(text_log,
                                "in vertex.m_ei[] and a closed edge index should appear twice.\n");
              ON_TextLog::PopIndent(text_log);
            }
            bVar1 = ON_BrepIsNotValid();
            return bVar1;
          }
        }
LAB_0052eae7:
        if ((pOVar8->m_vi[0] != vertex_index) && (pOVar8->m_vi[1] != vertex_index)) {
          if (text_log != (ON_TextLog *)0x0) {
            ON_TextLog::Print(text_log,"brep.m_V[%d] vertex is not valid.\n",
                              (ulong)(uint)vertex_index);
            ON_TextLog::PushIndent(text_log);
            ON_TextLog::Print(text_log,
                              "vertex.m_ei[%d] = %d but ON_Brep.m_E[%d].m_vi[] = [%d,%d]. At least one edge m_vi[] value should be %d.\n"
                              ,(ulong)local_40,(ulong)uVar3,(ulong)uVar3,
                              (ulong)(uint)pOVar8->m_vi[0],pOVar8->m_vi[1],vertex_index);
            ON_TextLog::PopIndent(text_log);
          }
          bVar1 = ON_BrepIsNotValid();
          return bVar1;
        }
      }
      if (0.0 < pOVar6->m_tolerance || pOVar6->m_tolerance == 0.0) {
        this_local._7_1_ = true;
      }
      else {
        if (text_log != (ON_TextLog *)0x0) {
          ON_TextLog::Print(text_log,"brep.m_V[%d] vertex is not valid.\n",(ulong)(uint)vertex_index
                           );
          ON_TextLog::PushIndent(text_log);
          ON_TextLog::Print(text_log,"vertex.m_tolerace = %g (should be >= 0.0)\n",
                            pOVar6->m_tolerance);
          ON_TextLog::PopIndent(text_log);
        }
        this_local._7_1_ = ON_BrepIsNotValid();
      }
    }
    else {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"brep.m_V[%d] vertex is not valid.\n",(ulong)(uint)vertex_index);
        ON_TextLog::PushIndent(text_log);
        ON_TextLog::Print(text_log,"vertex.m_vertex_index = %d (should be %d).\n",
                          (ulong)(uint)pOVar6->m_vertex_index,(ulong)(uint)vertex_index);
        ON_TextLog::PopIndent(text_log);
      }
      this_local._7_1_ = ON_BrepIsNotValid();
    }
  }
  return this_local._7_1_;
}

Assistant:

bool
ON_Brep::IsValidVertex( int vertex_index, ON_TextLog* text_log ) const
{
  if ( vertex_index < 0 || vertex_index >= m_V.Count() )
  {
    if ( text_log )
      text_log->Print("brep vertex_index = %d (should be >=0 and <%d=brep.m_V.Count() ).\n",
                      vertex_index, m_V.Count());
    return ON_BrepIsNotValid();
  }
  const ON_BrepVertex& vertex = m_V[vertex_index];
  if ( vertex.m_vertex_index != vertex_index )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_V[%d] vertex is not valid.\n",vertex_index);
      text_log->PushIndent();
      text_log->Print("vertex.m_vertex_index = %d (should be %d).\n",
                       vertex.m_vertex_index, vertex_index );
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }

  const int vertex_edge_count = vertex.m_ei.Count();
  int i, j, vei, ei;
  for ( vei = 0; vei < vertex_edge_count; vei++ ) {
    ei = vertex.m_ei[vei];
    if ( ei < 0 || ei >= m_E.Count() )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_V[%d] vertex is not valid.\n",vertex_index);
        text_log->PushIndent();
        text_log->Print("vertex.m_ei[%d] = %d (should be >=0 and <%d).\n", vei, ei, m_E.Count());
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }
    const ON_BrepEdge& edge = m_E[ei];
    if ( ei != edge.m_edge_index )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_V[%d] vertex is not valid.\n",vertex_index);
        text_log->PushIndent();
        text_log->Print("vertex.m_ei[%d] = %d is a deleted edge.\n", vei, ei);
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }
    for ( i = 0; i < vei; i++ ) 
    {
      if ( vertex.m_ei[i] == ei ) 
      {
        // edge should be closed
        if ( edge.m_vi[0] != vertex_index || edge.m_vi[1] != vertex_index )
        {
          if ( text_log )
          {
            text_log->Print("brep.m_V[%d] vertex is not valid.\n",vertex_index);
            text_log->PushIndent();
            text_log->Print("vertex.m_ei[%d] and vertex.m_ei[%d] = %d but brep.m_E[%d].m_vi[0] = %d",
                             i,vei,ei,ei,edge.m_vi[0]);
            text_log->Print("and ON_Brep.m_E[%d].m_vi[1] = %d (both m_vi[] values should be %d).\n",
                            ei,edge.m_vi[1],vertex_index);
            text_log->PopIndent();
          }
          return ON_BrepIsNotValid();
        }
        for (j = i+1; j < vei; j++ ) 
        {
          if ( vertex.m_ei[j] == ei )
          {
            if ( text_log )
            {
              text_log->Print("brep.m_V[%d] vertex is not valid.\n",vertex_index);
              text_log->PushIndent();
              text_log->Print("vertex.m_ei[%d,%d,%d] = %d. An open edge index should appear once\n",i,vei,j,ei);
              text_log->Print("in vertex.m_ei[] and a closed edge index should appear twice.\n");
              text_log->PopIndent();
            }
            return ON_BrepIsNotValid();
          }
        }
        break;
      }
    }
    if ( edge.m_vi[0] != vertex_index && edge.m_vi[1] != vertex_index )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_V[%d] vertex is not valid.\n",vertex_index);
        text_log->PushIndent();
        text_log->Print("vertex.m_ei[%d] = %d but ON_Brep.m_E[%d].m_vi[] = [%d,%d]. "
                        "At least one edge m_vi[] value should be %d.\n",
                        vei,ei,ei,edge.m_vi[0],edge.m_vi[1],vertex_index);
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }
  }

  if ( vertex.m_tolerance < 0.0 )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_V[%d] vertex is not valid.\n",vertex_index);
      text_log->PushIndent();
      text_log->Print("vertex.m_tolerace = %g (should be >= 0.0)\n",vertex.m_tolerance);
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }
  return true;
}